

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O1

xmlRelaxNGDefinePtr_conflict xmlRelaxNGNewDefine(xmlRelaxNGParserCtxtPtr ctxt,xmlNodePtr node)

{
  int iVar1;
  xmlRelaxNGDefinePtr_conflict *ppxVar2;
  xmlRelaxNGDefinePtr_conflict pxVar3;
  
  iVar1 = ctxt->defMax;
  if ((long)iVar1 == 0) {
    ctxt->defNr = 0;
    ctxt->defMax = 0x10;
    ppxVar2 = (xmlRelaxNGDefinePtr_conflict *)(*xmlMalloc)(0x80);
    ctxt->defTab = ppxVar2;
    if (ppxVar2 == (xmlRelaxNGDefinePtr_conflict *)0x0) goto LAB_001816fe;
  }
  else if (iVar1 <= ctxt->defNr) {
    ctxt->defMax = iVar1 * 2;
    ppxVar2 = (xmlRelaxNGDefinePtr_conflict *)(*xmlRealloc)(ctxt->defTab,(long)iVar1 << 4);
    if (ppxVar2 == (xmlRelaxNGDefinePtr_conflict *)0x0) {
      xmlRngPErrMemory(ctxt);
      return (xmlRelaxNGDefinePtr_conflict)0x0;
    }
    ctxt->defTab = ppxVar2;
  }
  pxVar3 = (xmlRelaxNGDefinePtr_conflict)(*xmlMalloc)(0x70);
  if (pxVar3 != (xmlRelaxNGDefinePtr_conflict)0x0) {
    pxVar3->depth = 0;
    pxVar3->dflags = 0;
    *(undefined4 *)&pxVar3->field_0x64 = 0;
    pxVar3->contModel = (xmlRegexpPtr)0x0;
    pxVar3->nameClass = (xmlRelaxNGDefinePtr)0x0;
    pxVar3->nextHash = (xmlRelaxNGDefinePtr)0x0;
    pxVar3->next = (xmlRelaxNGDefinePtr)0x0;
    pxVar3->attrs = (xmlRelaxNGDefinePtr)0x0;
    pxVar3->content = (xmlRelaxNGDefinePtr)0x0;
    pxVar3->parent = (xmlRelaxNGDefinePtr)0x0;
    pxVar3->value = (xmlChar *)0x0;
    pxVar3->data = (void *)0x0;
    pxVar3->name = (xmlChar *)0x0;
    pxVar3->ns = (xmlChar *)0x0;
    *(undefined8 *)pxVar3 = 0;
    pxVar3->node = (xmlNodePtr)0x0;
    iVar1 = ctxt->defNr;
    ctxt->defNr = iVar1 + 1;
    ctxt->defTab[iVar1] = pxVar3;
    pxVar3->node = node;
    pxVar3->depth = -1;
    return pxVar3;
  }
LAB_001816fe:
  xmlRngPErrMemory(ctxt);
  return (xmlRelaxNGDefinePtr_conflict)0x0;
}

Assistant:

static xmlRelaxNGDefinePtr
xmlRelaxNGNewDefine(xmlRelaxNGParserCtxtPtr ctxt, xmlNodePtr node)
{
    xmlRelaxNGDefinePtr ret;

    if (ctxt->defMax == 0) {
        ctxt->defMax = 16;
        ctxt->defNr = 0;
        ctxt->defTab = (xmlRelaxNGDefinePtr *)
            xmlMalloc(ctxt->defMax * sizeof(xmlRelaxNGDefinePtr));
        if (ctxt->defTab == NULL) {
            xmlRngPErrMemory(ctxt);
            return (NULL);
        }
    } else if (ctxt->defMax <= ctxt->defNr) {
        xmlRelaxNGDefinePtr *tmp;

        ctxt->defMax *= 2;
        tmp = (xmlRelaxNGDefinePtr *) xmlRealloc(ctxt->defTab,
                                                 ctxt->defMax *
                                                 sizeof
                                                 (xmlRelaxNGDefinePtr));
        if (tmp == NULL) {
            xmlRngPErrMemory(ctxt);
            return (NULL);
        }
        ctxt->defTab = tmp;
    }
    ret = (xmlRelaxNGDefinePtr) xmlMalloc(sizeof(xmlRelaxNGDefine));
    if (ret == NULL) {
        xmlRngPErrMemory(ctxt);
        return (NULL);
    }
    memset(ret, 0, sizeof(xmlRelaxNGDefine));
    ctxt->defTab[ctxt->defNr++] = ret;
    ret->node = node;
    ret->depth = -1;
    return (ret);
}